

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

StreamIn * prvTidyUserInput(TidyDocImpl *doc,TidyInputSource *source,int encoding)

{
  TidyGetByteFunc p_Var1;
  TidyUngetByteFunc p_Var2;
  TidyEOFFunc p_Var3;
  StreamIn *pSVar4;
  
  pSVar4 = prvTidyinitStreamIn(doc,encoding);
  p_Var1 = source->getByte;
  p_Var2 = source->ungetByte;
  p_Var3 = source->eof;
  (pSVar4->source).sourceData = source->sourceData;
  (pSVar4->source).getByte = p_Var1;
  (pSVar4->source).ungetByte = p_Var2;
  (pSVar4->source).eof = p_Var3;
  pSVar4->iotype = UserIO;
  return pSVar4;
}

Assistant:

StreamIn* TY_(UserInput)( TidyDocImpl* doc, TidyInputSource* source, int encoding )
{
    StreamIn *in = TY_(initStreamIn)( doc, encoding );
    memcpy( &in->source, source, sizeof(TidyInputSource) );
    in->iotype = UserIO;
    return in;
}